

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O1

int gdAffineScale(double *dst,double scale_x,double scale_y)

{
  *dst = scale_x;
  dst[1] = 0.0;
  dst[2] = 0.0;
  dst[3] = scale_y;
  dst[4] = 0.0;
  dst[5] = 0.0;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdAffineScale (double dst[6], const double scale_x, const double scale_y)
{
	dst[0] = scale_x;
	dst[1] = 0;
	dst[2] = 0;
	dst[3] = scale_y;
	dst[4] = 0;
	dst[5] = 0;
	return GD_TRUE;
}